

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsGetFalseValue(JsValueRef *falseValue)

{
  JsErrorCode JVar1;
  JsValueRef *local_10;
  JsValueRef *falseValue_local;
  
  local_10 = falseValue;
  JVar1 = ContextAPINoScriptWrapper_NoRecord<JsGetFalseValue::__0>
                    ((anon_class_8_1_68580fcc)&local_10,true,false);
  return JVar1;
}

Assistant:

CHAKRA_API JsGetFalseValue(_Out_ JsValueRef *falseValue)
{
    return ContextAPINoScriptWrapper_NoRecord([&] (Js::ScriptContext *scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(falseValue);

        *falseValue = scriptContext->GetLibrary()->GetFalse();

        return JsNoError;
    },
    /*allowInObjectBeforeCollectCallback*/true);
}